

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_action.c
# Opt level: O3

int s98c_register_encoding(s98c *ctx,char *encoding)

{
  char *pcVar1;
  
  if ((ctx->header).version != 3) {
    s98c_register_encoding_cold_1();
  }
  pcVar1 = strdup(encoding);
  ctx->source_encoding = pcVar1;
  return 0;
}

Assistant:

int s98c_register_encoding(struct s98c* ctx, char* encoding)
{
    if(ctx->header.version != 3) {
        fprintf(stderr, "warning: #encoding is ignored other than S98V3\n");
    }
#ifndef HAVE_ICONV
    fprintf(stderr, "warning: #encoding is ignored because s98c was built without iconv support\n");
#endif

    ctx->source_encoding = strdup(encoding);

    return 0;
}